

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayGet(InternalAnalyzer *this,ArrayGet *curr)

{
  bool bVar1;
  ArrayGet *curr_local;
  InternalAnalyzer *this_local;
  
  bVar1 = wasm::Type::isNull(&curr->ref->type);
  if (bVar1) {
    this->parent->trap = true;
  }
  else {
    this->parent->readsArray = true;
    this->parent->implicitTrap = true;
  }
  return;
}

Assistant:

void visitArrayGet(ArrayGet* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.readsArray = true;
      // traps when the arg is null or the index out of bounds
      parent.implicitTrap = true;
    }